

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Layer *pLVar1;
  bool bVar2;
  long in_RCX;
  undefined8 in_RDX;
  Mat *unaff_RBP;
  size_t in_RSI;
  long in_RDI;
  Option *unaff_R14;
  Mat *unaff_R15;
  Convolution *unaff_retaddr;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Mat weights [4];
  ParamDict pd;
  Layer *op;
  int num_input;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  int in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  Mat *in_stack_fffffffffffffd40;
  undefined1 *local_278;
  Mat *local_238;
  Mat local_1f0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [56];
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  Mat *in_stack_fffffffffffffea8;
  Mat *in_stack_fffffffffffffeb0;
  Mat *in_stack_fffffffffffffeb8;
  Mat *in_stack_fffffffffffffec0;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  Mat *in_stack_ffffffffffffff28;
  Option *in_stack_ffffffffffffff30;
  undefined1 auStack_78 [32];
  Layer *local_58;
  int local_4c;
  long local_48;
  undefined8 local_40;
  size_t local_38;
  int local_24;
  
  if (((*(byte *)(in_RCX + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x170) != 1)) {
    if ((*(int *)(in_RSI + 0x28) == 1) &&
       (((*(int *)(in_RDI + 0xd4) == 1 && (*(int *)(in_RDI + 0xd8) == 1)) &&
        (local_4c = *(int *)(in_RDI + 0x104) / *(int *)(in_RDI + 0xd0),
        *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x18) == local_4c)))) {
      local_48 = in_RCX;
      local_40 = in_RDX;
      local_38 = in_RSI;
      local_58 = create_layer(in_stack_fffffffffffffd2c);
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffffd40);
      ParamDict::set((ParamDict *)(auStack_78 + 0x10),0,*(int *)(in_RDI + 0xd0));
      ParamDict::set((ParamDict *)(auStack_78 + 0x10),1,*(int *)(in_RDI + 0x100));
      ParamDict::set((ParamDict *)(auStack_78 + 0x10),2,*(int *)(in_RDI + 0x104));
      ParamDict::set((ParamDict *)(auStack_78 + 0x10),8,*(int *)(in_RDI + 0x108));
      ParamDict::set((ParamDict *)(auStack_78 + 0x10),9,*(int *)(in_RDI + 0x10c));
      ParamDict::set((ParamDict *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     in_stack_fffffffffffffd1c,(Mat *)0x183cb9);
      (*local_58->_vptr_Layer[2])(local_58,auStack_78 + 0x10);
      local_238 = (Mat *)local_198;
      do {
        Mat::Mat(local_238);
        local_238 = local_238 + 1;
      } while (local_238 != (Mat *)auStack_78);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      if (*(int *)(in_RDI + 0x108) != 0) {
        Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      }
      pLVar1 = local_58;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffffd40,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      (*pLVar1->_vptr_Layer[3])(pLVar1,local_1a8);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      (*local_58->_vptr_Layer[4])(local_58,local_48);
      (*local_58->_vptr_Layer[7])(local_58,local_38,local_40,local_48);
      (*local_58->_vptr_Layer[5])(local_58,local_48);
      if (local_58 != (Layer *)0x0) {
        (*local_58->_vptr_Layer[1])();
      }
      local_24 = 0;
      local_278 = auStack_78;
      do {
        local_278 = local_278 + -0x48;
        Mat::~Mat((Mat *)0x183f8f);
      } while (local_278 != local_198);
      ParamDict::~ParamDict
                ((ParamDict *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    }
    else {
      Mat::Mat(&local_1f0);
      make_padding((Convolution *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (Option *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      if (bVar2) {
        local_24 = -100;
      }
      else {
        Mat::create(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38,
                    in_stack_fffffffffffffd34,
                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                    (Allocator *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        if (bVar2) {
          local_24 = -100;
        }
        else {
          local_24 = convolution(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                 in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                                 in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                                 in_stack_ffffffffffffff30);
          if (local_24 == 0) {
            local_24 = 0;
          }
        }
      }
      Mat::~Mat((Mat *)0x1842a8);
    }
  }
  else {
    local_24 = forward_int8(unaff_retaddr,unaff_RBP,unaff_R15,unaff_R14);
  }
  return local_24;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w * bottom_blob.elempack == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);
            pd.set(9, activation_type);
            pd.set(10, activation_params);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

#if NCNN_INT8
            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = bottom_blob_int8_scales;
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            op->destroy_pipeline(opt);

            delete op;

            return 0;
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}